

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags,mz_uint32 ext_attributes)

{
  mz_uint mVar1;
  mz_uint16 method;
  mz_uint16 mVar2;
  undefined1 uVar3;
  uint uVar4;
  int iVar5;
  tdefl_status tVar6;
  mz_bool mVar7;
  char *pcVar8;
  FILE *__stream;
  size_t sVar9;
  mz_uint8 *pmVar10;
  undefined1 *puVar11;
  char cVar12;
  size_t sVar13;
  size_t sVar14;
  undefined1 *puVar15;
  mz_uint64 mVar16;
  void *pvVar17;
  uint uVar18;
  ulong uVar19;
  mz_uint64 mVar20;
  ushort uVar21;
  undefined1 *puVar22;
  mz_uint16 dos_date_00;
  mz_uint64 in_stack_ffffffffffffef68;
  ulong uVar23;
  mz_ulong local_1088;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  undefined1 *local_1070;
  mz_uint8 *local_1068;
  size_t local_1060;
  tdefl_compressor *local_1058;
  mz_uint64 local_1050;
  ulong local_1048;
  void *local_1040;
  stat file_stat;
  
  dos_time = 0;
  dos_date = 0;
  uVar4 = 6;
  if (-1 < (int)level_and_flags) {
    uVar4 = level_and_flags;
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  if (pZip->m_pState == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pArchive_name == (char *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if (10 < (uVar4 & 0xf) || pComment == (void *)0x0 && comment_size != 0) {
    return 0;
  }
  if ((uVar4 >> 10 & 1) != 0) {
    return 0;
  }
  cVar12 = *pArchive_name;
  if (cVar12 == '/') {
    return 0;
  }
  mVar16 = pZip->m_archive_size;
  pcVar8 = pArchive_name + 1;
  while (cVar12 != '\0') {
    if (cVar12 == ':') {
      return 0;
    }
    if (cVar12 == '\\') {
      return 0;
    }
    cVar12 = *pcVar8;
    pcVar8 = pcVar8 + 1;
  }
  local_1040 = pComment;
  local_1060 = strlen(pArchive_name);
  if (0xffff < local_1060) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  mVar1 = pZip->m_file_offset_alignment;
  uVar19 = (ulong)(mVar1 - ((uint)mVar16 & mVar1 - 1) & mVar1 - 1);
  if (mVar1 == 0) {
    uVar19 = 0;
  }
  local_1050 = mVar16 + uVar19;
  if (local_1060 + comment_size + local_1050 + 0x4c >> 0x20 != 0) {
    return 0;
  }
  iVar5 = stat(pSrc_filename,(stat *)&file_stat);
  if (iVar5 != 0) {
    return 0;
  }
  mz_zip_time_t_to_dos_time(file_stat.st_mtim.tv_sec,&dos_time,&dos_date);
  __stream = fopen(pSrc_filename,"rb");
  if (__stream == (FILE *)0x0) {
    return 0;
  }
  fseeko(__stream,0,2);
  local_1070 = (undefined1 *)ftello(__stream);
  fseeko(__stream,0,0);
  if ((ulong)local_1070 >> 0x20 != 0) {
    fclose(__stream);
    return 0;
  }
  uVar4 = uVar4 & 0xf;
  if (local_1070 < &DAT_00000004) {
    uVar4 = 0;
  }
  uVar19 = uVar19 + 0x1e;
  sVar13 = 0x1000;
  if ((uint)uVar19 < 0x1000) {
    sVar13 = uVar19 & 0xffffffff;
  }
  local_1048 = (ulong)comment_size;
  memset(&file_stat,0,sVar13);
  mVar20 = mVar16;
  uVar23 = uVar19;
  do {
    sVar13 = local_1060;
    uVar18 = (uint)uVar19;
    if (uVar18 == 0) {
      if ((pZip->m_file_offset_alignment != 0) &&
         (((uint)local_1050 & pZip->m_file_offset_alignment - 1) != 0)) {
        __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/contrib/zip/src/miniz.h"
                      ,0x177f,
                      "mz_bool mz_zip_writer_add_file(mz_zip_archive *, const char *, const char *, const void *, mz_uint16, mz_uint, mz_uint32)"
                     );
      }
      mVar16 = uVar23 + mVar16;
      sVar14 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar16,pArchive_name,local_1060);
      if (sVar14 == sVar13) {
        mVar16 = mVar16 + local_1060;
        if (local_1070 == (undefined1 *)0x0) {
          puVar22 = (undefined1 *)0x0;
          uVar21 = 0;
          local_1088 = 0;
          goto LAB_006d9143;
        }
        pmVar10 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
        local_1068 = pmVar10;
        if (pmVar10 != (mz_uint8 *)0x0) {
          if (uVar4 == 0) {
            local_1088 = 0;
            puVar22 = local_1070;
            goto LAB_006d90c5;
          }
          local_1058 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
          if (local_1058 == (tdefl_compressor *)0x0) goto LAB_006d92b3;
          uVar19 = 10;
          if (uVar4 < 10) {
            uVar19 = (ulong)uVar4;
          }
          file_stat.st_nlink = 0;
          file_stat.st_dev = (__dev_t)pZip;
          file_stat.st_ino = mVar16;
          tdefl_init(local_1058,mz_zip_writer_add_put_buf_callback,&file_stat,
                     (uint)(uVar4 < 4) << 0xe |
                     tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar19]);
          pmVar10 = local_1068;
          local_1088 = 0;
          puVar22 = local_1070;
          goto LAB_006d900b;
        }
      }
      break;
    }
    sVar14 = 0x1000;
    if (uVar18 < 0x1000) {
      sVar14 = uVar19 & 0xffffffff;
    }
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar20,&file_stat,sVar14);
    mVar20 = mVar20 + sVar14;
    uVar19 = (ulong)(uVar18 - (int)sVar14);
  } while (sVar9 == sVar14);
  goto LAB_006d92c8;
  while( true ) {
    local_1088 = mz_crc32(local_1088,pmVar10,(size_t)puVar15);
    mVar16 = mVar16 + (long)puVar15;
    puVar22 = puVar22 + -(long)puVar15;
    if (puVar22 == (undefined1 *)0x0) break;
LAB_006d90c5:
    puVar15 = (undefined1 *)0x10000;
    if (puVar22 < (undefined1 *)0x10000) {
      puVar15 = puVar22;
    }
    puVar11 = (undefined1 *)fread(pmVar10,1,(size_t)puVar15,__stream);
    if ((puVar11 != puVar15) ||
       (puVar11 = (undefined1 *)(*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar16,pmVar10,(size_t)puVar15)
       , puVar11 != puVar15)) {
      pvVar17 = pZip->m_pAlloc_opaque;
      goto LAB_006d92c5;
    }
  }
  uVar21 = 0;
  puVar22 = local_1070;
LAB_006d9137:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_1068);
LAB_006d9143:
  fclose(__stream);
  mVar2 = dos_time;
  method = dos_date;
  if ((ulong)puVar22 >> 0x20 != 0) {
    return 0;
  }
  if (mVar16 >> 0x20 != 0) {
    return 0;
  }
  uVar3 = 0x14;
  if (uVar21 == 0) {
    uVar3 = 0;
  }
  file_stat.st_dev = CONCAT35(0,CONCAT14(uVar3,0x4034b50));
  file_stat.st_ino =
       CONCAT17((char)(local_1088 >> 8),
                CONCAT16((char)local_1088,
                         CONCAT15((char)(dos_date >> 8),
                                  CONCAT14((char)dos_date,
                                           CONCAT13((char)(dos_time >> 8),
                                                    CONCAT12((char)dos_time,uVar21))))));
  file_stat.st_nlink =
       CONCAT17((char)((ulong)local_1070 >> 8),
                CONCAT16((char)local_1070,
                         CONCAT15((char)((ulong)puVar22 >> 0x18),
                                  CONCAT14((char)((ulong)puVar22 >> 0x10),
                                           CONCAT13((char)((ulong)puVar22 >> 8),
                                                    CONCAT12((char)puVar22,
                                                             (short)(local_1088 >> 0x10)))))));
  file_stat.st_mode._0_1_ = (undefined1)((ulong)local_1070 >> 0x10);
  file_stat.st_mode._1_1_ = (undefined1)((ulong)local_1070 >> 0x18);
  file_stat.st_mode._2_1_ = (undefined1)local_1060;
  file_stat.st_mode._3_1_ = (undefined1)(local_1060 >> 8);
  file_stat.st_uid._0_2_ = 0;
  dos_date_00 = 0x9232;
  sVar14 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_1050,&file_stat,0x1e);
  if (sVar14 != 0x1e) {
    return 0;
  }
  mVar7 = mz_zip_writer_add_to_central_dir
                    (pZip,pArchive_name,(mz_uint16)local_1060,local_1040,(mz_uint16)local_1048,
                     local_1070,(mz_uint16)puVar22,local_1088,(ulong)uVar21,(uint)mVar2,method,
                     (mz_uint16)local_1050,(mz_uint16)ext_attributes,dos_date_00,
                     in_stack_ffffffffffffef68,(mz_uint32)mVar16);
  if (mVar7 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = mVar16;
  return 1;
  while( true ) {
    local_1088 = mz_crc32(local_1088,pmVar10,(size_t)puVar15);
    puVar22 = puVar22 + -(long)puVar15;
    tVar6 = tdefl_compress_buffer
                      (local_1058,pmVar10,(size_t)puVar15,(uint)(puVar22 == (undefined1 *)0x0) << 2)
    ;
    if (tVar6 != TDEFL_STATUS_OKAY) break;
LAB_006d900b:
    puVar15 = (undefined1 *)0x10000;
    if (puVar22 < (undefined1 *)0x10000) {
      puVar15 = puVar22;
    }
    puVar11 = (undefined1 *)fread(local_1068,1,(size_t)puVar15,__stream);
    if (puVar11 != puVar15) goto LAB_006d92a7;
  }
  if (tVar6 == TDEFL_STATUS_DONE) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_1058);
    uVar21 = 8;
    puVar22 = (undefined1 *)file_stat.st_nlink;
    mVar16 = file_stat.st_ino;
    goto LAB_006d9137;
  }
LAB_006d92a7:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_1058);
LAB_006d92b3:
  pvVar17 = pZip->m_pAlloc_opaque;
  pmVar10 = local_1068;
LAB_006d92c5:
  (*pZip->m_pFree)(pvVar17,pmVar10);
LAB_006d92c8:
  fclose(__stream);
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive *pZip, const char *pArchive_name,
                               const char *pSrc_filename, const void *pComment,
                               mz_uint16 comment_size, mz_uint level_and_flags,
                               mz_uint32 ext_attributes) {
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  time_t file_modified_time;
  mz_uint64 local_dir_header_ofs, cur_archive_file_ofs, uncomp_size = 0,
                                                        comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  MZ_FILE *pSrc_file = NULL;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) ||
      ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;

  local_dir_header_ofs = cur_archive_file_ofs = pZip->m_archive_size;

  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  memset(&file_modified_time, 0, sizeof(file_modified_time));
  if (!mz_zip_get_file_modified_time(pSrc_filename, &file_modified_time))
    return MZ_FALSE;
  mz_zip_time_t_to_dos_time(file_modified_time, &dos_time, &dos_date);

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return MZ_FALSE;
  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  if (uncomp_size > 0xFFFFFFFF) {
    // No zip64 support yet
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  if (uncomp_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes +
                                     sizeof(local_dir_header))) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs +=
      num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                     archive_name_size) != archive_name_size) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (uncomp_size) {
    mz_uint64 uncomp_remaining = uncomp_size;
    void *pRead_buf =
        pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      MZ_FCLOSE(pSrc_file);
      return MZ_FALSE;
    }

    if (!level) {
      while (uncomp_remaining) {
        mz_uint n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
        if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) ||
            (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf,
                            n) != n)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          MZ_FCLOSE(pSrc_file);
          return MZ_FALSE;
        }
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
        uncomp_remaining -= n;
        cur_archive_file_ofs += n;
      }
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(
          pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                     tdefl_create_comp_flags_from_zip_params(
                         level, -15, MZ_DEFAULT_STRATEGY)) !=
          TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      for (;;) {
        size_t in_buf_size =
            (mz_uint32)MZ_MIN(uncomp_remaining, MZ_ZIP_MAX_IO_BUF_SIZE);
        tdefl_status status;

        if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
          break;

        uncomp_crc32 = (mz_uint32)mz_crc32(
            uncomp_crc32, (const mz_uint8 *)pRead_buf, in_buf_size);
        uncomp_remaining -= in_buf_size;

        status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size,
                                       uncomp_remaining ? TDEFL_NO_FLUSH
                                                        : TDEFL_FINISH);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY)
          break;
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;

      method = MZ_DEFLATED;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  MZ_FCLOSE(pSrc_file);
  pSrc_file = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(
          pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size,
          comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header,
                     sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment,
          comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0,
          dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}